

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__calculate_filters
               (stbir__sampler *samp,stbir__sampler *other_axis_for_pivot,void *user_data)

{
  float fVar1;
  stbir_edge sVar2;
  uint uVar3;
  uint uVar4;
  stbir__kernel_callback *psVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  stbir__contributors *psVar11;
  stbir_uint32 sVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  stbir_uint32 num_contributors;
  float *pfVar17;
  stbir__contributors *psVar18;
  int iVar19;
  stbir_uint32 sVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  stbir__contributors *psVar24;
  int iVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  int local_ec;
  float *local_e0;
  
  fVar31 = (samp->scale_info).scale;
  psVar5 = samp->filter_kernel;
  fVar28 = (samp->scale_info).inv_scale;
  num_contributors = samp->num_contributors;
  psVar24 = samp->contributors;
  local_e0 = samp->coefficients;
  local_ec = samp->coefficient_width;
  iVar19 = samp->is_gather;
  if ((iVar19 != 0) && (iVar19 != 2)) {
    if (iVar19 != 1) {
      return;
    }
    fVar28 = (*samp->filter_support)(fVar28,user_data);
    sVar20 = (samp->scale_info).scale_numerator;
    if ((int)num_contributors <= (int)sVar20) {
      sVar20 = num_contributors;
    }
    if ((samp->scale_info).scale_is_rational == 0) {
      sVar20 = num_contributors;
    }
    if (0 < (int)sVar20) {
      fVar31 = fVar31 * fVar28;
      fVar28 = (samp->scale_info).inv_scale;
      fVar1 = (samp->scale_info).pixel_shift;
      iVar19 = (samp->scale_info).input_full_size;
      sVar2 = samp->edge;
      sVar12 = 0;
      pfVar17 = local_e0;
      psVar18 = psVar24;
      do {
        fVar32 = (float)(int)sVar12 + 0.5;
        fVar29 = ((fVar32 - fVar31) + fVar1) * fVar28 + 0.5;
        fVar30 = (float)(int)fVar29;
        iVar14 = (int)((float)(-(uint)(fVar29 < fVar30) & 0xbf800000) + fVar30);
        fVar29 = (fVar31 + fVar32 + fVar1) * fVar28 + -0.5;
        fVar30 = (float)(int)fVar29;
        iVar6 = (int)((float)(-(uint)(fVar29 < fVar30) & 0xbf800000) + fVar30);
        if (iVar6 <= iVar14) {
          iVar6 = iVar14;
        }
        if (sVar2 == STBIR_EDGE_WRAP) {
          if (iVar14 <= -iVar19) {
            iVar14 = -iVar19;
          }
          if (iVar19 * 2 <= iVar6) {
            iVar6 = iVar19 * 2 + -1;
          }
        }
        iVar26 = local_ec + -1 + iVar14;
        if (iVar6 - iVar14 < local_ec) {
          iVar26 = iVar6;
        }
        iVar6 = -1;
        if (iVar14 <= iVar26) {
          iVar25 = 0;
          iVar6 = -1;
          do {
            fVar29 = (*psVar5)((fVar32 + fVar1) * fVar28 - ((float)(iVar14 + iVar25) + 0.5),fVar28,
                               user_data);
            iVar22 = iVar25;
            if ((7.523164e-37 <= ABS(fVar29)) || (fVar29 = 0.0, iVar22 = iVar6, iVar25 != 0)) {
              iVar6 = iVar22;
              pfVar17[iVar25] = fVar29;
              iVar25 = iVar25 + 1;
            }
            else {
              if (iVar26 == iVar14) {
                __assert_fail("( in_last_pixel - in_first_pixel ) != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                              ,0xce9,
                              "void stbir__calculate_coefficients_for_gather_upsample(float, stbir__kernel_callback *, stbir__scale_info *, int, stbir__contributors *, float *, int, stbir_edge, void *)"
                             );
              }
              iVar14 = iVar14 + 1;
              iVar25 = 0;
            }
          } while (iVar25 <= iVar26 - iVar14);
        }
        psVar18->n0 = iVar14;
        psVar18->n1 = iVar14 + iVar6;
        if (iVar6 < 0) {
          __assert_fail("contributors->n1 >= contributors->n0",
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0xcfa,
                        "void stbir__calculate_coefficients_for_gather_upsample(float, stbir__kernel_callback *, stbir__scale_info *, int, stbir__contributors *, float *, int, stbir_edge, void *)"
                       );
        }
        psVar18 = psVar18 + 1;
        pfVar17 = pfVar17 + local_ec;
        sVar12 = sVar12 + 1;
      } while (sVar12 != sVar20);
    }
    stbir__cleanup_gathered_coefficients
              (samp->edge,&samp->extent_info,&samp->scale_info,num_contributors,psVar24,local_e0,
               local_ec);
    return;
  }
  iVar19 = (samp->scale_info).input_full_size;
  fVar31 = (*samp->filter_support)(fVar31,user_data);
  uVar3 = samp->filter_pixel_margin;
  if (samp->is_gather == 0) {
    if (other_axis_for_pivot != (stbir__sampler *)0x0) {
      psVar24 = other_axis_for_pivot->contributors;
      local_e0 = other_axis_for_pivot->coefficients;
      local_ec = other_axis_for_pivot->coefficient_width;
      num_contributors = other_axis_for_pivot->num_contributors;
      (samp->extent_info).lowest = (other_axis_for_pivot->extent_info).lowest;
      (samp->extent_info).highest = (other_axis_for_pivot->extent_info).highest;
      (samp->extent_info).widest = (other_axis_for_pivot->extent_info).widest;
      goto LAB_001b1457;
    }
    psVar24 = samp->gather_prescatter_contributors;
    local_e0 = samp->gather_prescatter_coefficients;
    local_ec = samp->gather_prescatter_coefficient_width;
    num_contributors = samp->gather_prescatter_num_contributors;
  }
  iVar19 = iVar19 + uVar3;
  iVar26 = -uVar3;
  iVar14 = (samp->scale_info).output_sub_size;
  uVar13 = (samp->scale_info).scale_numerator;
  iVar6 = (samp->scale_info).scale_is_rational;
  if (iVar19 != iVar26 && SBORROW4(iVar19,iVar26) == (int)(iVar19 + uVar3) < 0) {
    fVar28 = fVar28 * fVar31;
    fVar31 = (samp->scale_info).scale;
    fVar1 = (samp->scale_info).pixel_shift;
    lVar8 = (long)local_ec;
    iVar25 = -1;
    do {
      fVar29 = (float)iVar26 + 0.5;
      fVar30 = ((fVar29 - fVar28) * fVar31 - fVar1) + 0.5;
      fVar32 = (float)(int)fVar30;
      fVar33 = ((fVar28 + fVar29) * fVar31 - fVar1) + -0.5;
      fVar34 = (float)(int)fVar33;
      iVar22 = (int)((float)(-(uint)(fVar33 < fVar34) & 0xbf800000) + fVar34);
      if (iVar14 <= iVar22) {
        iVar22 = iVar14 + -1;
      }
      uVar7 = (uint)((float)(-(uint)(fVar30 < fVar32) & 0xbf800000) + fVar32);
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      if (iVar22 < (int)uVar7) {
LAB_001b126e:
        bVar27 = false;
      }
      else if (iVar6 == 0 || iVar14 <= (int)uVar13) {
LAB_001b1269:
        if (iVar22 < (int)uVar7) goto LAB_001b126e;
        uVar15 = (ulong)uVar7;
        uVar23 = (ulong)((iVar22 - uVar7) + 1);
        pfVar17 = (float *)(lVar8 * 4 * uVar15 + (long)local_e0);
        lVar21 = 0;
        uVar16 = uVar15;
        do {
          fVar30 = (*psVar5)((float)(int)uVar16 + 0.5 + (fVar1 - fVar29 * fVar31),fVar31,user_data);
          if ((long)iVar25 < (long)uVar16) {
            if (uVar16 != iVar25 + 1) {
              __assert_fail("out == ( first_out_inited + 1 )",
                            "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                            ,0xd6d,
                            "void stbir__calculate_coefficients_for_gather_downsample(int, int, float, stbir__kernel_callback *, stbir__scale_info *, int, int, stbir__contributors *, float *, void *)"
                           );
            }
            psVar24[uVar16].n0 = iVar26;
            psVar24[uVar16].n1 = iVar26;
            pfVar10 = pfVar17;
            iVar25 = (int)uVar16;
          }
          else {
            if ((*pfVar17 == 0.0) && (!NAN(*pfVar17))) {
              if (iVar26 - psVar24[uVar16].n0 != 1) {
                __assert_fail("( in_pixel - contribs->n0 ) == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                              ,0xd78,
                              "void stbir__calculate_coefficients_for_gather_downsample(int, int, float, stbir__kernel_callback *, stbir__scale_info *, int, int, stbir__contributors *, float *, void *)"
                             );
              }
              psVar24[uVar16].n0 = iVar26;
            }
            psVar24[uVar16].n1 = iVar26;
            lVar9 = (long)iVar26 - (long)psVar24[uVar16].n0;
            if (local_ec <= (int)lVar9) {
              __assert_fail("( in_pixel - contribs->n0 ) < coefficient_width",
                            "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                            ,0xd7c,
                            "void stbir__calculate_coefficients_for_gather_downsample(int, int, float, stbir__kernel_callback *, stbir__scale_info *, int, int, stbir__contributors *, float *, void *)"
                           );
            }
            pfVar10 = local_e0 + (uVar15 + lVar21) * lVar8 + lVar9;
          }
          *pfVar10 = (float)(~-(uint)(ABS(fVar30 * fVar31) < 7.523164e-37) & (uint)(fVar30 * fVar31)
                            );
          lVar21 = lVar21 + 1;
          uVar16 = uVar16 + 1;
          pfVar17 = pfVar17 + lVar8;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
        bVar27 = false;
      }
      else {
        bVar27 = true;
        if (uVar7 != uVar13) {
          if ((int)uVar13 <= iVar22) {
            iVar22 = uVar13 - 1;
          }
          goto LAB_001b1269;
        }
      }
    } while ((!bVar27) && (iVar26 = iVar26 + 1, iVar26 != iVar19));
  }
  stbir__cleanup_gathered_coefficients
            (samp->edge,&samp->extent_info,&samp->scale_info,num_contributors,psVar24,local_e0,
             local_ec);
  if (samp->is_gather != 0) {
    return;
  }
LAB_001b1457:
  uVar13 = ~uVar3;
  if (0 < (int)num_contributors) {
    sVar20 = 0;
    do {
      uVar7 = psVar24->n0;
      uVar4 = psVar24->n1;
      if ((int)uVar7 <= (int)uVar4) {
        iVar19 = samp->coefficient_width;
        psVar18 = samp->contributors + (int)(uVar3 + uVar7);
        pfVar17 = samp->coefficients + (int)((uVar3 + uVar7) * iVar19);
        pfVar10 = local_e0;
        do {
          fVar31 = *pfVar10;
          if (7.523164e-37 <= ABS(fVar31)) {
            if (((int)uVar13 < (int)uVar7) || (psVar18->n1 < psVar18->n0)) {
              psVar11 = samp->contributors + (int)(uVar13 + uVar3);
              while (psVar11 = psVar11 + 1, psVar11 < psVar18) {
                psVar11->n0 = 0;
                psVar11->n1 = -1;
              }
              psVar18->n0 = sVar20;
              psVar18->n1 = sVar20;
              *pfVar17 = fVar31;
              uVar13 = uVar7;
            }
            else {
              stbir__insert_coeff(psVar18,pfVar17,sVar20,fVar31,iVar19);
            }
            if (iVar19 <= psVar18->n1 - psVar18->n0) {
              __assert_fail("( scatter_contributors->n1 - scatter_contributors->n0 + 1 ) <= scatter_coefficient_width"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                            ,0xf92,
                            "void stbir__calculate_filters(stbir__sampler *, stbir__sampler *, void *)"
                           );
            }
          }
          pfVar10 = pfVar10 + 1;
          psVar18 = psVar18 + 1;
          pfVar17 = pfVar17 + iVar19;
          bVar27 = uVar7 != uVar4;
          uVar7 = uVar7 + 1;
        } while (bVar27);
      }
      psVar24 = psVar24 + 1;
      local_e0 = local_e0 + local_ec;
      sVar20 = sVar20 + 1;
    } while (sVar20 != num_contributors);
  }
  psVar18 = samp->contributors;
  iVar19 = samp->num_contributors;
  psVar24 = psVar18 + (int)(uVar13 + uVar3);
  while (psVar24 = psVar24 + 1, psVar24 < psVar18 + iVar19) {
    psVar24->n0 = 0;
    psVar24->n1 = -1;
  }
  return;
}

Assistant:

static void stbir__calculate_filters( stbir__sampler * samp, stbir__sampler * other_axis_for_pivot, void * user_data STBIR_ONLY_PROFILE_BUILD_GET_INFO )
{
  int n;
  float scale = samp->scale_info.scale;
  stbir__kernel_callback * kernel = samp->filter_kernel;
  stbir__support_callback * support = samp->filter_support;
  float inv_scale = samp->scale_info.inv_scale;
  int input_full_size = samp->scale_info.input_full_size;
  int gather_num_contributors = samp->num_contributors;
  stbir__contributors* gather_contributors = samp->contributors;
  float * gather_coeffs = samp->coefficients;
  int gather_coefficient_width = samp->coefficient_width;

  switch ( samp->is_gather )
  {
    case 1: // gather upsample
    {
      float out_pixels_radius = support(inv_scale,user_data) * scale;

      stbir__calculate_coefficients_for_gather_upsample( out_pixels_radius, kernel, &samp->scale_info, gather_num_contributors, gather_contributors, gather_coeffs, gather_coefficient_width, samp->edge, user_data );

      STBIR_PROFILE_BUILD_START( cleanup );
      stbir__cleanup_gathered_coefficients( samp->edge, &samp->extent_info, &samp->scale_info, gather_num_contributors, gather_contributors, gather_coeffs, gather_coefficient_width );
      STBIR_PROFILE_BUILD_END( cleanup );
    }
    break;

    case 0: // scatter downsample (only on vertical)
    case 2: // gather downsample
    {
      float in_pixels_radius = support(scale,user_data) * inv_scale;
      int filter_pixel_margin = samp->filter_pixel_margin;
      int input_end = input_full_size + filter_pixel_margin;

      // if this is a scatter, we do a downsample gather to get the coeffs, and then pivot after
      if ( !samp->is_gather )
      {
        // check if we are using the same gather downsample on the horizontal as this vertical,
        //   if so, then we don't have to generate them, we can just pivot from the horizontal.
        if ( other_axis_for_pivot )
        {
          gather_contributors = other_axis_for_pivot->contributors;
          gather_coeffs = other_axis_for_pivot->coefficients;
          gather_coefficient_width = other_axis_for_pivot->coefficient_width;
          gather_num_contributors = other_axis_for_pivot->num_contributors;
          samp->extent_info.lowest = other_axis_for_pivot->extent_info.lowest;
          samp->extent_info.highest = other_axis_for_pivot->extent_info.highest;
          samp->extent_info.widest = other_axis_for_pivot->extent_info.widest;
          goto jump_right_to_pivot;
        }

        gather_contributors = samp->gather_prescatter_contributors;
        gather_coeffs = samp->gather_prescatter_coefficients;
        gather_coefficient_width = samp->gather_prescatter_coefficient_width;
        gather_num_contributors = samp->gather_prescatter_num_contributors;
      }

      stbir__calculate_coefficients_for_gather_downsample( -filter_pixel_margin, input_end, in_pixels_radius, kernel, &samp->scale_info, gather_coefficient_width, gather_num_contributors, gather_contributors, gather_coeffs, user_data );

      STBIR_PROFILE_BUILD_START( cleanup );
      stbir__cleanup_gathered_coefficients( samp->edge, &samp->extent_info, &samp->scale_info, gather_num_contributors, gather_contributors, gather_coeffs, gather_coefficient_width );
      STBIR_PROFILE_BUILD_END( cleanup );

      if ( !samp->is_gather )
      {
        // if this is a scatter (vertical only), then we need to pivot the coeffs
        stbir__contributors * scatter_contributors;
        int highest_set;

        jump_right_to_pivot:

        STBIR_PROFILE_BUILD_START( pivot );

        highest_set = (-filter_pixel_margin) - 1;
        for (n = 0; n < gather_num_contributors; n++)
        {
          int k;
          int gn0 = gather_contributors->n0, gn1 = gather_contributors->n1;
          int scatter_coefficient_width = samp->coefficient_width;
          float * scatter_coeffs = samp->coefficients + ( gn0 + filter_pixel_margin ) * scatter_coefficient_width;
          float * g_coeffs = gather_coeffs;
          scatter_contributors = samp->contributors + ( gn0 + filter_pixel_margin );

          for (k = gn0 ; k <= gn1 ; k++ )
          {
            float gc = *g_coeffs++;
            
            // skip zero and denormals - must skip zeros to avoid adding coeffs beyond scatter_coefficient_width
            //   (which happens when pivoting from horizontal, which might have dummy zeros)
            if ( ( ( gc >= stbir__small_float ) || ( gc <= -stbir__small_float ) ) )
            {
              if ( ( k > highest_set ) || ( scatter_contributors->n0 > scatter_contributors->n1 ) )
              {
                {
                  // if we are skipping over several contributors, we need to clear the skipped ones
                  stbir__contributors * clear_contributors = samp->contributors + ( highest_set + filter_pixel_margin + 1);
                  while ( clear_contributors < scatter_contributors )
                  {
                    clear_contributors->n0 = 0;
                    clear_contributors->n1 = -1;
                    ++clear_contributors;
                  }
                }
                scatter_contributors->n0 = n;
                scatter_contributors->n1 = n;
                scatter_coeffs[0]  = gc;
                highest_set = k;
              }
              else
              {
                stbir__insert_coeff( scatter_contributors, scatter_coeffs, n, gc, scatter_coefficient_width );
              }
              STBIR_ASSERT( ( scatter_contributors->n1 - scatter_contributors->n0 + 1 ) <= scatter_coefficient_width );
            }
            ++scatter_contributors;
            scatter_coeffs += scatter_coefficient_width;
          }

          ++gather_contributors;
          gather_coeffs += gather_coefficient_width;
        }

        // now clear any unset contribs
        {
          stbir__contributors * clear_contributors = samp->contributors + ( highest_set + filter_pixel_margin + 1);
          stbir__contributors * end_contributors = samp->contributors + samp->num_contributors;
          while ( clear_contributors < end_contributors )
          {
            clear_contributors->n0 = 0;
            clear_contributors->n1 = -1;
            ++clear_contributors;
          }
        }

        STBIR_PROFILE_BUILD_END( pivot );
      }
    }
    break;
  }
}